

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O2

bool __thiscall
Rml::ElementText::GenerateLine
          (ElementText *this,String *line,int *line_length,float *line_width,int line_begin,
          float maximum_line_width,float right_spacing_width,bool trim_whitespace_prefix,
          bool decode_escape_characters,bool allow_empty)

{
  float fVar1;
  uint uVar2;
  pointer pcVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ComputedValues *this_00;
  char *pcVar8;
  char *pcVar9;
  Element *pEVar10;
  byte bVar11;
  char *p_begin;
  bool collapse_white_space;
  undefined7 in_register_00000089;
  bool break_at_endline;
  uint uVar13;
  bool bVar14;
  float fVar15;
  Character local_ec;
  char *next_token_begin;
  undefined4 local_dc;
  float *local_d8;
  char *local_d0;
  uint local_c8;
  uint local_c4;
  float local_c0;
  int local_bc;
  int *local_b8;
  FontEngineInterface *local_b0;
  ulong local_a8;
  ulong local_a0;
  FontFaceHandle local_98;
  char *local_90;
  char *local_88;
  String token;
  StringView local_60;
  StringView local_50;
  TextShapingContext text_shaping_context;
  byte bVar12;
  
  local_dc = (undefined4)CONCAT71(in_register_00000089,trim_whitespace_prefix);
  local_d8 = line_width;
  local_c0 = right_spacing_width;
  local_b8 = line_length;
  if ((maximum_line_width < 0.0) &&
     (bVar5 = Assert("RMLUI_ASSERT(maximum_line_width >= 0.f)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementText.cpp"
                     ,0xbc), !bVar5)) {
    pcVar4 = (code *)invalidInstructionException();
    (*pcVar4)();
  }
  local_98 = Element::GetFontFaceHandle(&this->super_Element);
  line->_M_string_length = 0;
  *(line->_M_dataplus)._M_p = '\0';
  *local_b8 = 0;
  *local_d8 = 0.0;
  if (local_98 == 0) {
    pEVar10 = Element::GetParentNode(&this->super_Element);
    if (pEVar10 != (Element *)0x0) {
      this = (ElementText *)Element::GetParentNode(&this->super_Element);
    }
    LogMissingFontFace(&this->super_Element);
    bVar5 = true;
  }
  else {
    this_00 = Element::GetComputedValues(&this->super_Element);
    bVar12 = (byte)((uint)*(undefined4 *)&(this_00->inherited).field_0x14 >> 0x18);
    bVar11 = bVar12 & 7;
    break_at_endline = bVar11 == 4 || (bVar12 & 5) == 1;
    text_shaping_context.language = &(this_00->inherited).language;
    text_shaping_context.text_direction = bVar12 >> 5 & (Rtl|Ltr);
    text_shaping_context.letter_spacing = Style::ComputedValues::letter_spacing(this_00);
    uVar2 = *(uint *)&(this_00->inherited).field_0x14;
    uVar13 = uVar2 >> 0x1b;
    local_b0 = GetFontEngineInterface();
    pcVar3 = (this->text)._M_dataplus._M_p;
    p_begin = pcVar3 + line_begin;
    local_d0 = pcVar3 + (this->text)._M_string_length;
    local_a0 = (ulong)decode_escape_characters;
    local_a8 = (ulong)((byte)(uVar2 >> 0x14) & 3);
    collapse_white_space = (bool)(0x15U >> bVar11 & 1);
    local_c8 = uVar13 & 3;
    local_c4 = uVar13 & 0xffffff03;
    do {
      bVar5 = p_begin == local_d0;
      if (bVar5) {
        return bVar5;
      }
      token._M_dataplus._M_p = (pointer)&token.field_2;
      token._M_string_length = 0;
      token.field_2._M_local_buf[0] = '\0';
      next_token_begin = p_begin;
      if (line->_M_string_length == 0) {
        local_ec = Null;
        bVar14 = true;
      }
      else {
        pcVar8 = (line->_M_dataplus)._M_p;
        pcVar8 = StringUtilities::SeekBackwardUTF8(pcVar8 + (line->_M_string_length - 1),pcVar8);
        local_ec = StringUtilities::ToCharacter
                             (pcVar8,(line->_M_dataplus)._M_p + line->_M_string_length);
        bVar14 = line->_M_string_length == 0;
      }
      bVar14 = BuildToken(&token,&next_token_begin,local_d0,(bool)(bVar14 & (byte)local_dc),
                          collapse_white_space,break_at_endline,(TextTransform)local_a8,
                          SUB81(local_a0,0));
      StringView::StringView(&local_50,&token);
      iVar7 = (*local_b0->_vptr_FontEngineInterface[9])
                        (local_b0,local_98,local_50.p_begin,local_50.p_end,&text_shaping_context,
                         (ulong)local_ec);
      pcVar8 = next_token_begin;
      if ((0x19U >> bVar11 & 0.0 <= maximum_line_width) == 0) {
LAB_00297424:
        ::std::__cxx11::string::append((string *)line);
        *local_b8 = *local_b8 + ((int)next_token_begin - (int)p_begin);
        *local_d8 = (float)iVar7 + *local_d8;
        if ((bVar14 == false) || ((bVar14 = false, !allow_empty && (line->_M_string_length == 0))))
        {
          bVar14 = true;
          p_begin = next_token_begin;
        }
      }
      else {
        bVar6 = LastToken(next_token_begin,local_d0,collapse_white_space,break_at_endline);
        fVar1 = *local_d8;
        fVar15 = fVar1;
        if (bVar6) {
          fVar15 = fVar1 + local_c0;
        }
        if (iVar7 <= (int)(maximum_line_width - fVar15)) goto LAB_00297424;
        if ((char)local_c4 == '\x01') {
LAB_002972f0:
          local_bc = (int)(maximum_line_width - fVar1);
          pcVar8 = p_begin + ((int)pcVar8 - (int)p_begin);
          local_90 = p_begin + 1;
          local_88 = pcVar8;
          do {
            pcVar9 = StringUtilities::SeekBackwardUTF8(pcVar8 + -1,p_begin);
            pcVar8 = pcVar9;
            if (pcVar9 == p_begin) {
              if ((allow_empty) || (line->_M_string_length != 0)) goto LAB_00297491;
              pcVar8 = StringUtilities::SeekForwardUTF8(local_90,local_88);
            }
            token._M_string_length = 0;
            *token._M_dataplus._M_p = '\0';
            next_token_begin = p_begin;
            BuildToken(&token,&next_token_begin,pcVar8,
                       (bool)(line->_M_string_length == 0 & (byte)local_dc),collapse_white_space,
                       break_at_endline,(TextTransform)local_a8,SUB81(local_a0,0));
            StringView::StringView(&local_60,&token);
            iVar7 = (*local_b0->_vptr_FontEngineInterface[9])
                              (local_b0,local_98,local_60.p_begin,local_60.p_end,
                               &text_shaping_context,(ulong)local_ec);
            bVar14 = true;
          } while ((pcVar9 != p_begin) && (local_bc < iVar7));
          goto LAB_00297424;
        }
        if (local_c8 == 2) {
          if (line->_M_string_length == 0) goto LAB_002972f0;
        }
        else if ((!allow_empty) && (line->_M_string_length == 0)) goto LAB_00297424;
LAB_00297491:
        bVar14 = false;
      }
      ::std::__cxx11::string::~string((string *)&token);
    } while (bVar14);
  }
  return bVar5;
}

Assistant:

bool ElementText::GenerateLine(String& line, int& line_length, float& line_width, int line_begin, float maximum_line_width, float right_spacing_width,
	bool trim_whitespace_prefix, bool decode_escape_characters, bool allow_empty)
{
	RMLUI_ZoneScoped;
	RMLUI_ASSERT(
		maximum_line_width >= 0.f); // TODO: Check all callers for conformance, check break at line condition below. Possibly check for FLT_MAX.

	FontFaceHandle font_face_handle = GetFontFaceHandle();

	// Initialise the output variables.
	line.clear();
	line_length = 0;
	line_width = 0;

	// Bail if we don't have a valid font face.
	if (font_face_handle == 0)
	{
		LogMissingFontFace(GetParentNode() ? GetParentNode() : this);
		return true;
	}

	// Determine how we are processing white-space while formatting the text.
	using namespace Style;
	const auto& computed = GetComputedValues();
	WhiteSpace white_space_property = computed.white_space();
	bool collapse_white_space =
		white_space_property == WhiteSpace::Normal || white_space_property == WhiteSpace::Nowrap || white_space_property == WhiteSpace::Preline;
	bool break_at_line = (maximum_line_width >= 0) &&
		(white_space_property == WhiteSpace::Normal || white_space_property == WhiteSpace::Prewrap || white_space_property == WhiteSpace::Preline);
	bool break_at_endline =
		white_space_property == WhiteSpace::Pre || white_space_property == WhiteSpace::Prewrap || white_space_property == WhiteSpace::Preline;

	const TextShapingContext text_shaping_context{computed.language(), computed.direction(), computed.letter_spacing()};
	TextTransform text_transform_property = computed.text_transform();
	WordBreak word_break = computed.word_break();

	FontEngineInterface* font_engine_interface = GetFontEngineInterface();

	// Starting at the line_begin character, we generate sections of the text (we'll call them tokens) depending on the
	// white-space parsing parameters. Each section is then appended to the line if it can fit. If not, or if an
	// endline is found (and we're processing them), then the line is ended. kthxbai!
	const char* token_begin = text.c_str() + line_begin;
	const char* string_end = text.c_str() + text.size();
	while (token_begin != string_end)
	{
		String token;
		const char* next_token_begin = token_begin;
		Character previous_codepoint = Character::Null;
		if (!line.empty())
			previous_codepoint =
				StringUtilities::ToCharacter(StringUtilities::SeekBackwardUTF8(&line.back(), line.data()), line.data() + line.size());

		// Generate the next token and determine its pixel-length.
		bool break_line = BuildToken(token, next_token_begin, string_end, line.empty() && trim_whitespace_prefix, collapse_white_space,
			break_at_endline, text_transform_property, decode_escape_characters);
		int token_width = font_engine_interface->GetStringWidth(font_face_handle, token, text_shaping_context, previous_codepoint);

		// If we're breaking to fit a line box, check if the token can fit on the line before we add it.
		if (break_at_line)
		{
			const bool is_last_token = LastToken(next_token_begin, string_end, collapse_white_space, break_at_endline);
			int max_token_width = int(maximum_line_width - (is_last_token ? line_width + right_spacing_width : line_width));

			if (token_width > max_token_width)
			{
				if (word_break == WordBreak::BreakAll || (word_break == WordBreak::BreakWord && line.empty()))
				{
					// Try to break up the word
					max_token_width = int(maximum_line_width - line_width);
					const int token_max_size = int(next_token_begin - token_begin);
					const char* partial_string_end = token_begin + token_max_size;

					// @performance: Can be made much faster. Use string width heuristics and logarithmic search.
					while (true)
					{
						partial_string_end = StringUtilities::SeekBackwardUTF8(partial_string_end - 1, token_begin);

						bool force_loop_break_at_end = false;
						if (partial_string_end == token_begin)
						{
							// Not even the first character of the token fits. Let it overflow onto the next line if we can.
							if (allow_empty || !line.empty())
								return false;

							// Continue by forcing the first character to be consumed, even though it will overflow.
							partial_string_end = StringUtilities::SeekForwardUTF8(token_begin + 1, token_begin + token_max_size);
							force_loop_break_at_end = true;
						}

						token.clear();
						next_token_begin = token_begin;
						BuildToken(token, next_token_begin, partial_string_end, line.empty() && trim_whitespace_prefix, collapse_white_space,
							break_at_endline, text_transform_property, decode_escape_characters);
						token_width = font_engine_interface->GetStringWidth(font_face_handle, token, text_shaping_context, previous_codepoint);

						if (force_loop_break_at_end || token_width <= max_token_width)
							break;
					}

					break_line = true;
				}
				else if (allow_empty || !line.empty())
				{
					// Let the token overflow into the next line.
					return false;
				}
			}
		}

		// The token can fit on the end of the line, so add it onto the end and increment our width and length counters.
		line += token;
		line_length += (int)(next_token_begin - token_begin);
		line_width += token_width;

		// Break out of the loop if an endline was forced.
		if (break_line && (allow_empty || !line.empty()))
			return false;

		// Set the beginning of the next token.
		token_begin = next_token_begin;
	}

	return true;
}